

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O3

void BrotliCompressFragmentTwoPassImpl10
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,uint32_t *command_buf,
               uint8_t *literal_buf,int *table,size_t *storage_ix,uint8_t *storage)

{
  int *piVar1;
  long *plVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *puVar6;
  byte bVar7;
  undefined4 in_register_0000000c;
  uint32_t *commands;
  ulong uVar8;
  int iVar9;
  long *input_00;
  size_t input_size_00;
  ulong uVar10;
  long *__src;
  long *__src_00;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int *piVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  long *plVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  long *plVar23;
  long *plVar24;
  bool bVar25;
  uint *local_98;
  uint32_t *local_90;
  
  commands = (uint32_t *)CONCAT44(in_register_0000000c,is_last);
  input_00 = (long *)input;
  if (input_size != 0) {
    do {
      input_size_00 = 0x20000;
      if (input_size < 0x20000) {
        input_size_00 = input_size;
      }
      plVar2 = (long *)((long)input_00 + input_size_00);
      __src_00 = input_00;
      local_90 = command_buf;
      local_98 = commands;
      if (0xf < input_size) {
        uVar10 = input_size - 0x10;
        if (input_size_00 - 4 < input_size - 0x10) {
          uVar10 = input_size_00 - 4;
        }
        plVar24 = (long *)(uVar10 + (long)input_00);
        uVar10 = 0xffffffff;
        __src = input_00;
LAB_00120745:
        lVar15 = *(long *)((long)__src + 1);
        iVar12 = (int)uVar10;
        uVar11 = 0x20;
        plVar23 = (long *)((long)__src + 1);
        do {
          plVar18 = (long *)((ulong)(uVar11 >> 5) + (long)plVar23);
          __src_00 = __src;
          if (plVar24 < plVar18) break;
          uVar20 = (ulong)(lVar15 * 0x1e35a7bd00000000) >> 0x36;
          lVar15 = *plVar18;
          iVar9 = (int)plVar23;
          iVar22 = (int)input;
          if (((int)*plVar23 == *(int *)((long)plVar23 + -(long)iVar12)) && (0 < iVar12)) {
            puVar6 = (uint8_t *)((long)plVar23 + -(long)iVar12);
            *(int *)(literal_buf + uVar20 * 4) = iVar9 - iVar22;
LAB_001207b1:
            uVar20 = (long)plVar23 - (long)puVar6;
            if ((long)uVar20 < 0x3fff1) goto LAB_001207c7;
          }
          else {
            iVar3 = *(int *)(literal_buf + uVar20 * 4);
            *(int *)(literal_buf + uVar20 * 4) = iVar9 - iVar22;
            if ((int)*plVar23 == *(int *)(input + iVar3)) {
              puVar6 = input + iVar3;
              goto LAB_001207b1;
            }
          }
          uVar11 = uVar11 + 1;
          plVar23 = plVar18;
        } while( true );
      }
LAB_00120cfa:
      if (__src_00 < plVar2) {
        uVar11 = (uint)((long)plVar2 - (long)__src_00);
        if (5 < uVar11) {
          if (uVar11 < 0x82) {
            uVar11 = uVar11 - 2;
            uVar4 = 0x1f;
            if (uVar11 != 0) {
              for (; uVar11 >> uVar4 == 0; uVar4 = uVar4 - 1) {
              }
            }
            bVar7 = (char)(uVar4 ^ 0xffffffe0) + 0x1f;
            uVar5 = uVar11 >> (bVar7 & 0x1f);
            uVar11 = (uVar11 - (uVar5 << (bVar7 & 0x1f))) * 0x100 |
                     uVar5 + (uVar4 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (uVar11 < 0x842) {
            uVar4 = 0x1f;
            if (uVar11 - 0x42 != 0) {
              for (; uVar11 - 0x42 >> uVar4 == 0; uVar4 = uVar4 - 1) {
              }
            }
            uVar11 = (((-1 << ((byte)uVar4 & 0x1f)) + uVar11 + -0x42) * 0x100 - (uVar4 ^ 0x1f)) +
                     0x29;
          }
          else {
            iVar12 = uVar11 * 0x100;
            if (uVar11 < 0x1842) {
              uVar11 = iVar12 - 0x841eb;
            }
            else if (uVar11 < 0x5842) {
              uVar11 = iVar12 - 0x1841ea;
            }
            else {
              uVar11 = iVar12 - 0x5841e9;
            }
          }
        }
        *local_98 = uVar11;
        local_98 = local_98 + 1;
        uVar10 = (long)plVar2 - (long)__src_00 & 0xffffffff;
        memcpy(local_90,__src_00,uVar10);
        local_90 = (uint32_t *)((long)local_90 + uVar10);
      }
      iVar12 = ShouldCompress((uint8_t *)input_00,input_size_00,(long)local_90 - (long)command_buf);
      if (iVar12 == 0) {
        BrotliStoreMetaBlockHeader(input_size_00,1,(size_t *)table,(uint8_t *)storage_ix);
        iVar12 = *table;
        *(ulong *)table = (ulong)(iVar12 + 7U & 0xfffffff8);
        memcpy((void *)((ulong)(iVar12 + 7U >> 3) + (long)storage_ix),input_00,input_size_00);
        uVar10 = input_size_00 * 8 + *(long *)table;
        *(ulong *)table = uVar10;
        *(undefined1 *)((long)storage_ix + (uVar10 >> 3)) = 0;
      }
      else {
        BrotliStoreMetaBlockHeader(input_size_00,0,(size_t *)table,(uint8_t *)storage_ix);
        uVar10 = *(ulong *)table;
        uVar20 = uVar10 >> 3;
        *(ulong *)((long)storage_ix + uVar20) = (ulong)*(byte *)((long)storage_ix + uVar20);
        *(ulong *)table = uVar10 + 0xd;
        StoreCommands(m,(uint8_t *)command_buf,(long)local_90 - (long)command_buf,commands,
                      (long)local_98 - (long)commands >> 2,(size_t *)table,(uint8_t *)storage_ix);
      }
      input_size = input_size - input_size_00;
      input_00 = plVar2;
    } while (input_size != 0);
  }
  return;
LAB_001207c7:
  piVar1 = (int *)((long)plVar23 + 4);
  uVar8 = (long)plVar2 + (-4 - (long)plVar23);
  if (7 < uVar8) {
    uVar13 = uVar8 & 0xfffffffffffffff8;
    piVar14 = (int *)(uVar13 + (long)piVar1);
    lVar15 = 0;
    uVar21 = 0;
LAB_001207fd:
    if (*(ulong *)(piVar1 + uVar21 * 2) == *(ulong *)(puVar6 + uVar21 * 8 + 4))
    goto code_r0x0012080b;
    uVar13 = *(ulong *)(puVar6 + uVar21 * 8 + 4) ^ *(ulong *)(piVar1 + uVar21 * 2);
    uVar8 = 0;
    if (uVar13 != 0) {
      for (; (uVar13 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
      }
    }
    uVar21 = (uVar8 >> 3 & 0x1fffffff) - lVar15;
    goto LAB_00120834;
  }
  uVar13 = 0;
  piVar14 = piVar1;
LAB_00120cab:
  uVar8 = uVar8 & 7;
  uVar21 = uVar13;
  if (uVar8 != 0) {
    uVar16 = uVar13 | uVar8;
    do {
      uVar21 = uVar13;
      if (puVar6[uVar13 + 4] != (uint8_t)*piVar14) break;
      piVar14 = (int *)((long)piVar14 + 1);
      uVar13 = uVar13 + 1;
      uVar8 = uVar8 - 1;
      uVar21 = uVar16;
    } while (uVar8 != 0);
  }
LAB_00120834:
  uVar4 = iVar9 - (int)__src;
  uVar11 = uVar4;
  if (5 < uVar4) {
    if (uVar4 < 0x82) {
      uVar5 = uVar4 - 2;
      uVar11 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      bVar7 = (char)(uVar11 ^ 0xffffffe0) + 0x1f;
      uVar17 = uVar5 >> (bVar7 & 0x1f);
      uVar11 = (uVar5 - (uVar17 << (bVar7 & 0x1f))) * 0x100 |
               uVar17 + (uVar11 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar4 < 0x842) {
      uVar11 = 0x1f;
      if (uVar4 - 0x42 != 0) {
        for (; uVar4 - 0x42 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar11 = (((-1 << ((byte)uVar11 & 0x1f)) + uVar4 + -0x42) * 0x100 - (uVar11 ^ 0x1f)) + 0x29;
    }
    else {
      iVar9 = uVar4 * 0x100;
      if (uVar4 < 0x1842) {
        uVar11 = iVar9 - 0x841eb;
      }
      else if (uVar4 < 0x5842) {
        uVar11 = iVar9 - 0x1841ea;
      }
      else {
        uVar11 = iVar9 - 0x5841e9;
      }
    }
  }
  *local_98 = uVar11;
  memcpy(local_90,__src,(long)(int)uVar4);
  uVar11 = 0x40;
  if (iVar12 != (int)uVar20) {
    uVar5 = (int)uVar20 + 3;
    uVar11 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    bVar7 = 0x1e - (char)(uVar11 ^ 0x1f);
    bVar25 = (uVar5 >> (bVar7 & 0x1f) & 1) != 0;
    uVar11 = (uint)bVar25 +
             ((uVar5 - (bVar25 + 2 << (bVar7 & 0x1f))) * 0x100 | (uVar11 ^ 0x1f) * 2 ^ 0x3e) + 0x4c;
    uVar10 = uVar20 & 0xffffffff;
  }
  uVar20 = uVar21 + 4;
  local_98[1] = uVar11;
  if (uVar20 < 0xc) {
    local_98[2] = (int)uVar20 + 0x14;
    lVar15 = 0xc;
  }
  else if (uVar20 < 0x48) {
    uVar11 = 0x1f;
    uVar5 = (uint)(uVar21 - 4);
    if (uVar5 != 0) {
      for (; uVar5 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    bVar7 = (char)(uVar11 ^ 0xffffffe0) + 0x1f;
    iVar12 = (int)(uVar21 - 4 >> (bVar7 & 0x3f));
    local_98[2] = (uVar5 - (iVar12 << (bVar7 & 0x1f))) * 0x100 |
                  iVar12 + (uVar11 ^ 0xffffffe0) * 2 + 0x5a;
    lVar15 = 0xc;
  }
  else if (uVar20 < 0x88) {
    local_98[2] = ((uint)(uVar21 - 4) & 0x1f) << 8 | (int)(uVar21 - 4 >> 5) + 0x36U;
    local_98[3] = 0x40;
    lVar15 = 0x10;
  }
  else {
    if (uVar20 < 0x848) {
      uVar11 = (int)uVar21 - 0x44;
      iVar12 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> iVar12 == 0; iVar12 = iVar12 + -1) {
        }
      }
      local_98[2] = ((int)(-1L << ((byte)iVar12 & 0x3f)) + (int)uVar21 + -0x44) * 0x100 + iVar12 +
                    0x34;
    }
    else {
      local_98[2] = (int)uVar20 * 0x100 - 0x847c1;
    }
    local_98[3] = 0x40;
    lVar15 = 0x10;
  }
  __src_00 = (long *)((long)plVar23 + uVar21 + 4);
  local_90 = (uint32_t *)((long)local_90 + (long)(int)uVar4);
  local_98 = (uint *)((long)local_98 + lVar15);
  if (plVar24 <= __src_00) goto LAB_00120cfa;
  uVar20 = *(ulong *)((long)plVar23 + uVar21 + 1);
  uVar8 = (uVar20 & 0xffffffff000000) * 0x1e35a7bd00 >> 0x36;
  iVar12 = (int)__src_00 - iVar22;
  *(int *)(literal_buf + ((uVar20 & 0xffffffff00) * 0x1e35a7bd000000 >> 0x36) * 4) = iVar12 + -2;
  *(int *)(literal_buf + (uVar20 * 0x1e35a7bd00000000 >> 0x36) * 4) = iVar12 + -1;
  lVar15 = (long)*(int *)(literal_buf + uVar8 * 4);
  *(int *)(literal_buf + uVar8 * 4) = iVar12;
  piVar1 = (int *)(input + lVar15);
  __src = __src_00;
  uVar20 = (long)__src_00 - (long)piVar1;
  while ((uVar8 = uVar20, (long)uVar8 < 0x3fff1 && ((int)*__src == *piVar1))) {
    piVar1 = (int *)((long)__src + 4);
    uVar10 = (long)plVar2 + (-4 - (long)__src);
    if (7 < uVar10) {
      uVar20 = uVar10 & 0xfffffffffffffff8;
      piVar14 = (int *)((long)piVar1 + uVar20);
      lVar19 = 0;
      uVar13 = 0;
LAB_00120a59:
      if (*(ulong *)(piVar1 + uVar13 * 2) == *(ulong *)(input + uVar13 * 8 + lVar15 + 4))
      goto code_r0x00120a66;
      uVar20 = *(ulong *)(input + uVar13 * 8 + lVar15 + 4) ^ *(ulong *)(piVar1 + uVar13 * 2);
      uVar10 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      uVar13 = (uVar10 >> 3 & 0x1fffffff) - lVar19;
      goto LAB_00120a9b;
    }
    uVar20 = 0;
    piVar14 = piVar1;
LAB_00120bf6:
    uVar10 = uVar10 & 7;
    uVar13 = uVar20;
    if (uVar10 != 0) {
      uVar21 = uVar20 | uVar10;
      do {
        uVar13 = uVar20;
        if (input[uVar20 + lVar15 + 4] != (uint8_t)*piVar14) break;
        piVar14 = (int *)((long)piVar14 + 1);
        uVar20 = uVar20 + 1;
        uVar10 = uVar10 - 1;
        uVar13 = uVar21;
      } while (uVar10 != 0);
    }
LAB_00120a9b:
    uVar10 = uVar13 + 4;
    if (uVar10 < 10) {
      uVar11 = (int)uVar10 + 0x26;
    }
    else if (uVar10 < 0x86) {
      uVar11 = 0x1f;
      uVar4 = (uint)(uVar13 - 2);
      if (uVar4 != 0) {
        for (; uVar4 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      bVar7 = (char)(uVar11 ^ 0xffffffe0) + 0x1f;
      iVar12 = (int)(uVar13 - 2 >> (bVar7 & 0x3f));
      uVar11 = (uVar4 - (iVar12 << (bVar7 & 0x1f))) * 0x100 |
               iVar12 + (uVar11 ^ 0xffffffe0) * 2 + 0x6a;
    }
    else if (uVar10 < 0x846) {
      uVar11 = (int)uVar13 - 0x42;
      iVar12 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> iVar12 == 0; iVar12 = iVar12 + -1) {
        }
      }
      uVar11 = ((int)(-1L << ((byte)iVar12 & 0x3f)) + (int)uVar13 + -0x42) * 0x100 + iVar12 + 0x34;
    }
    else {
      uVar11 = (int)uVar10 * 0x100 - 0x845c1;
    }
    __src_00 = (long *)((long)__src + uVar13 + 4);
    *local_98 = uVar11;
    uVar4 = (int)uVar8 + 3;
    uVar11 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    bVar7 = 0x1e - (char)(uVar11 ^ 0x1f);
    bVar25 = (uVar4 >> (bVar7 & 0x1f) & 1) != 0;
    local_98[1] = ((uVar4 - (bVar25 + 2 << (bVar7 & 0x1f))) * 0x100 | (uVar11 ^ 0x1f) * 2 ^ 0x3e) +
                  (uint)bVar25 + 0x4c;
    local_98 = local_98 + 2;
    if (plVar24 <= __src_00) goto LAB_00120cfa;
    uVar10 = *(ulong *)((long)__src + uVar13 + 1);
    uVar20 = (uVar10 & 0xffffffff000000) * 0x1e35a7bd00 >> 0x36;
    iVar12 = (int)__src_00 - iVar22;
    *(int *)(literal_buf + (uVar10 * 0x1e35a7bd00000000 >> 0x36) * 4) = iVar12 + -3;
    *(int *)(literal_buf + ((uVar10 & 0xffffffff00) * 0x1e35a7bd000000 >> 0x36) * 4) = iVar12 + -2;
    *(int *)(literal_buf + ((uVar10 & 0xffffffff0000) * 0x1e35a7bd0000 >> 0x36) * 4) = iVar12 + -1;
    lVar15 = (long)*(int *)(literal_buf + uVar20 * 4);
    *(int *)(literal_buf + uVar20 * 4) = iVar12;
    piVar1 = (int *)(input + lVar15);
    __src = __src_00;
    uVar20 = (long)__src_00 - (long)piVar1;
    uVar10 = uVar8;
  }
  goto LAB_00120745;
code_r0x0012080b:
  uVar21 = uVar21 + 1;
  lVar15 = lVar15 + -8;
  if (uVar8 >> 3 == uVar21) goto LAB_00120cab;
  goto LAB_001207fd;
code_r0x00120a66:
  uVar13 = uVar13 + 1;
  lVar19 = lVar19 + -8;
  if (uVar10 >> 3 == uVar13) goto LAB_00120bf6;
  goto LAB_00120a59;
}

Assistant:

void BrotliCompressFragmentTwoPass(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          m, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    RewindBitPosition(initial_storage_ix, storage_ix, storage);
    EmitUncompressedMetaBlock(input, input_size, storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}